

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

int svd_gr(double *A,int M,int N,double *U,double *V,double *q)

{
  long lVar1;
  size_t __size;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  void *__ptr;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  double *pdVar22;
  ulong uVar23;
  uint uVar24;
  double *pdVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  double *pdVar32;
  long lVar33;
  uint uVar34;
  int iVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double __x;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double *local_110;
  ulong local_e8;
  ulong local_d0;
  int local_a0;
  double *local_90;
  double *local_88;
  double *local_78;
  void *local_70;
  int local_60;
  double *local_50;
  ulong local_40;
  int local_38;
  
  uVar6 = (ulong)N;
  __size = uVar6 * 8;
  __ptr = malloc(__size);
  dVar36 = macheps();
  if (0 < N * M) {
    uVar12 = 0;
    do {
      U[uVar12] = A[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uint)(N * M) != uVar12);
  }
  if (0 < N) {
    uVar10 = (ulong)(N - 1);
    uVar7 = (ulong)(uint)N;
    lVar13 = (long)M;
    uVar14 = (ulong)(uint)M;
    local_88 = U + 1;
    local_78 = U + uVar7;
    uVar27 = 1;
    uVar18 = 0;
    dVar42 = 0.0;
    dVar41 = 0.0;
    pvVar17 = __ptr;
    uVar12 = 0;
    pdVar9 = U;
    pdVar32 = U;
    dVar40 = 0.0;
    local_50 = (double *)uVar14;
    local_40 = uVar7;
    do {
      uVar19 = uVar12 + 1;
      *(double *)((long)__ptr + uVar12 * 8) = dVar42 * dVar41;
      if ((long)uVar12 < lVar13) {
        dVar41 = 0.0;
        pdVar8 = local_50;
        pdVar16 = pdVar32;
        do {
          dVar41 = dVar41 + ABS(*pdVar16);
          pdVar16 = pdVar16 + uVar7;
          pdVar8 = (double *)((long)pdVar8 - 1);
        } while (pdVar8 != (double *)0x0);
        dVar42 = 0.0;
        local_60 = (int)uVar12;
        if ((dVar41 != 0.0) || (NAN(dVar41))) {
          dVar43 = 0.0;
          pdVar8 = local_50;
          pdVar16 = pdVar32;
          do {
            dVar42 = *pdVar16 / dVar41;
            *pdVar16 = dVar42;
            dVar43 = dVar43 + dVar42 * dVar42;
            pdVar16 = pdVar16 + uVar7;
            pdVar8 = (double *)((long)pdVar8 - 1);
          } while (pdVar8 != (double *)0x0);
          iVar3 = (N + 1) * local_60;
          dVar38 = U[iVar3];
          if (dVar43 < 0.0) {
            dVar42 = sqrt(dVar43);
          }
          else {
            dVar42 = SQRT(dVar43);
          }
          dVar42 = (double)(~-(ulong)(dVar38 < 0.0) & (ulong)-dVar42 |
                           -(ulong)(dVar38 < 0.0) & (ulong)dVar42);
          U[iVar3] = dVar38 - dVar42;
          pdVar8 = local_50;
          pdVar16 = pdVar32;
          if (uVar12 < uVar10) {
            pdVar25 = local_88;
            uVar15 = uVar27;
            do {
              dVar37 = 0.0;
              lVar28 = 0;
              pdVar22 = local_50;
              do {
                dVar37 = dVar37 + *(double *)((long)pdVar32 + lVar28) *
                                  *(double *)((long)pdVar25 + lVar28);
                lVar28 = lVar28 + uVar7 * 8;
                pdVar22 = (double *)((long)pdVar22 - 1);
              } while (pdVar22 != (double *)0x0);
              lVar28 = 0;
              pdVar22 = local_50;
              do {
                *(double *)((long)pdVar25 + lVar28) =
                     *(double *)((long)pdVar32 + lVar28) * (dVar37 / (dVar38 * dVar42 - dVar43)) +
                     *(double *)((long)pdVar25 + lVar28);
                lVar28 = lVar28 + uVar7 * 8;
                pdVar22 = (double *)((long)pdVar22 - 1);
              } while (pdVar22 != (double *)0x0);
              uVar15 = uVar15 + 1;
              pdVar25 = pdVar25 + 1;
            } while (uVar15 != uVar7);
          }
          do {
            *pdVar16 = *pdVar16 * dVar41;
            pdVar8 = (double *)((long)pdVar8 - 1);
            pdVar16 = pdVar16 + uVar7;
          } while (pdVar8 != (double *)0x0);
        }
        q[uVar12] = dVar41 * dVar42;
        if ((uVar12 == uVar10) || (lVar13 <= (long)uVar19)) goto LAB_0013ee58;
        dVar42 = 0.0;
        uVar15 = 1;
        do {
          dVar42 = dVar42 + ABS(pdVar9[uVar18 + uVar15]);
          uVar15 = uVar15 + 1;
        } while (local_50 != (double *)uVar15);
        dVar41 = 0.0;
        if ((dVar42 != 0.0) || (NAN(dVar42))) {
          dVar43 = 0.0;
          if ((long)uVar19 < (long)uVar6) {
            uVar15 = 1;
            do {
              dVar41 = pdVar9[uVar18 + uVar15] / dVar42;
              pdVar9[uVar18 + uVar15] = dVar41;
              dVar43 = dVar43 + dVar41 * dVar41;
              uVar15 = uVar15 + 1;
            } while (local_40 != uVar15);
          }
          local_38 = (int)uVar19;
          uVar24 = local_60 * N + local_38;
          dVar38 = U[uVar24];
          if (dVar43 < 0.0) {
            dVar41 = sqrt(dVar43);
          }
          else {
            dVar41 = SQRT(dVar43);
          }
          dVar41 = (double)(~-(ulong)(dVar38 < 0.0) & (ulong)-dVar41 |
                           -(ulong)(dVar38 < 0.0) & (ulong)dVar41);
          U[uVar24] = dVar38 - dVar41;
          if ((long)uVar19 < (long)uVar6) {
            uVar15 = 1;
            do {
              *(double *)((long)pvVar17 + uVar15 * 8) =
                   pdVar9[uVar18 + uVar15] / (dVar38 * dVar41 - dVar43);
              uVar15 = uVar15 + 1;
            } while (local_40 != uVar15);
          }
          pdVar8 = local_78;
          uVar15 = uVar27;
          if ((long)uVar19 < lVar13) {
            do {
              if ((long)uVar19 < (long)uVar6) {
                dVar43 = 0.0;
                uVar23 = 1;
                do {
                  dVar43 = dVar43 + pdVar8[uVar23] * pdVar9[uVar18 + uVar23];
                  uVar23 = uVar23 + 1;
                } while (local_40 != uVar23);
                if ((long)uVar19 < (long)uVar6) {
                  uVar23 = 1;
                  do {
                    pdVar8[uVar23] =
                         *(double *)((long)pvVar17 + uVar23 * 8) * dVar43 + pdVar8[uVar23];
                    uVar23 = uVar23 + 1;
                  } while (local_40 != uVar23);
                }
              }
              uVar15 = uVar15 + 1;
              pdVar8 = pdVar8 + uVar7;
            } while (uVar15 != uVar14);
          }
          if ((long)uVar19 < (long)uVar6) {
            uVar15 = 1;
            do {
              pdVar9[uVar18 + uVar15] = pdVar9[uVar18 + uVar15] * dVar42;
              uVar15 = uVar15 + 1;
            } while (local_40 != uVar15);
          }
        }
      }
      else {
        q[uVar12] = 0.0;
LAB_0013ee58:
        dVar41 = 0.0;
        dVar42 = 0.0;
      }
      dVar43 = ABS(*(double *)((long)__ptr + uVar12 * 8)) + ABS(q[uVar12]);
      if (dVar43 <= dVar40) {
        dVar43 = dVar40;
      }
      uVar27 = uVar27 + 1;
      pdVar32 = pdVar32 + uVar7 + 1;
      local_50 = (double *)((long)local_50 - 1);
      local_88 = local_88 + uVar7 + 1;
      pdVar9 = pdVar9 + 1;
      uVar18 = (ulong)(uint)((int)uVar18 + N);
      local_40 = local_40 - 1;
      pvVar17 = (void *)((long)pvVar17 + 8);
      local_78 = local_78 + uVar7 + 1;
      uVar12 = uVar19;
      dVar40 = dVar43;
    } while (uVar19 != uVar7);
    if (0 < N) {
      lVar28 = (uVar6 - 1) * uVar6;
      pdVar9 = U + lVar28;
      pdVar32 = V + uVar6;
      pdVar8 = V + lVar28;
      uVar12 = uVar6;
      pdVar16 = V;
      do {
        pdVar16 = pdVar16 + -1;
        pdVar32 = pdVar32 + -1;
        uVar18 = uVar12 - 1;
        if ((long)uVar12 <= (long)uVar10) {
          local_40._0_4_ = (int)uVar12;
          uVar27 = (ulong)(int)local_40;
          if (((dVar41 != 0.0) || (NAN(dVar41))) && ((int)local_40 < N)) {
            pdVar22 = (double *)((uVar6 * 8 + 8) * uVar27 + (long)V);
            pdVar25 = (double *)((long)pdVar32 + __size * uVar27);
            dVar40 = U[uVar18 * uVar6 + uVar12];
            uVar19 = (ulong)(int)local_40;
            do {
              *pdVar25 = pdVar9[uVar19] / (dVar41 * dVar40);
              uVar19 = uVar19 + 1;
              pdVar25 = pdVar25 + uVar6;
            } while (uVar6 != uVar19);
            if ((int)local_40 < N) {
              uVar19 = (long)(int)local_40;
              do {
                dVar41 = 0.0;
                pdVar25 = pdVar22;
                uVar15 = (long)(int)local_40;
                do {
                  dVar41 = dVar41 + pdVar9[uVar15] * *pdVar25;
                  uVar15 = uVar15 + 1;
                  pdVar25 = pdVar25 + uVar6;
                } while (uVar6 != uVar15);
                lVar33 = 0;
                lVar28 = uVar6 - uVar27;
                do {
                  *(double *)((long)pdVar22 + lVar33) =
                       *(double *)((long)pdVar16 + lVar33 + (uVar27 * 8 + 8) * uVar6) * dVar41 +
                       *(double *)((long)pdVar22 + lVar33);
                  lVar33 = lVar33 + __size;
                  lVar28 = lVar28 + -1;
                } while (lVar28 != 0);
                uVar19 = uVar19 + 1;
                pdVar22 = pdVar22 + 1;
              } while (uVar19 != uVar6);
            }
          }
          if ((int)local_40 < N) {
            pdVar25 = (double *)(__size * uVar27 + (long)pdVar32);
            do {
              *pdVar25 = 0.0;
              pdVar8[uVar27] = 0.0;
              uVar27 = uVar27 + 1;
              pdVar25 = pdVar25 + uVar6;
            } while (uVar6 != uVar27);
          }
        }
        V[uVar18 + (long)((int)uVar18 * N)] = 1.0;
        dVar41 = *(double *)((long)__ptr + uVar18 * 8);
        pdVar9 = pdVar9 + -uVar6;
        pdVar8 = pdVar8 + -uVar6;
        bVar2 = 1 < (long)uVar12;
        uVar12 = uVar18;
      } while (bVar2);
      if (0 < N) {
        uVar11 = N * N;
        uVar4 = ~N;
        local_50 = U + uVar6 * uVar6 + -1;
        uVar5 = (N + 1) * N;
        uVar24 = uVar5 - 1;
        uVar34 = uVar11 - 1;
        uVar18 = 0;
        uVar12 = uVar6;
        local_e8 = uVar10;
        local_78._0_4_ = uVar11;
        do {
          dVar41 = q[uVar12 - 1];
          if ((long)uVar12 < (long)uVar6 && (long)uVar12 <= (long)uVar10) {
            memset(U + (int)(uVar4 * (int)uVar18 + uVar11),0,
                   (uVar18 * 8 + 0x7fffffff8 & 0x7fffffff8) + 8);
          }
          uVar27 = uVar12 - 1;
          if ((dVar41 != 0.0) || (NAN(dVar41))) {
            if (uVar27 != uVar10 && (long)uVar12 < (long)uVar6) {
              uVar19 = uVar12 & 0xffffffff;
              uVar21 = (uint)local_78;
              uVar26 = uVar5;
              do {
                dVar42 = 0.0;
                dVar40 = 0.0;
                if ((long)uVar12 < lVar13) {
                  uVar15 = uVar12 & 0xffffffff;
                  uVar30 = uVar24;
                  uVar31 = uVar26;
                  do {
                    dVar42 = dVar42 + U[uVar30] * U[uVar31];
                    uVar31 = uVar31 + N;
                    uVar30 = uVar30 + N;
                    uVar29 = (int)uVar15 + 1;
                    uVar15 = (ulong)uVar29;
                    dVar40 = dVar42;
                  } while ((int)uVar29 < M);
                }
                if ((long)uVar12 <= lVar13) {
                  dVar42 = U[uVar27 * (uVar6 + 1)];
                  uVar15 = local_e8;
                  uVar31 = uVar34;
                  uVar30 = uVar21;
                  do {
                    U[uVar30] = U[uVar31] * ((dVar40 / dVar42) / dVar41) + U[uVar30];
                    uVar30 = uVar30 + N;
                    uVar31 = uVar31 + N;
                    uVar29 = (int)uVar15 + 1;
                    uVar15 = (ulong)uVar29;
                  } while ((int)uVar29 < M);
                }
                uVar31 = (int)uVar19 + 1;
                uVar19 = (ulong)uVar31;
                uVar26 = uVar26 + 1;
                uVar21 = uVar21 + 1;
              } while (uVar31 != N);
            }
            uVar19 = lVar13 + 1U;
            pdVar9 = local_50;
            if ((long)uVar12 <= lVar13) {
              do {
                *pdVar9 = *pdVar9 / dVar41;
                uVar19 = uVar19 - 1;
                pdVar9 = pdVar9 + uVar6;
              } while (uVar12 != uVar19);
            }
          }
          else {
            uVar19 = lVar13 + 1U;
            pdVar9 = local_50;
            if ((long)uVar12 <= lVar13) {
              do {
                *pdVar9 = 0.0;
                pdVar9 = pdVar9 + uVar6;
                uVar19 = uVar19 - 1;
              } while (uVar12 != uVar19);
            }
          }
          lVar28 = (long)((int)uVar27 * N);
          U[uVar27 + lVar28] = U[uVar27 + lVar28] + 1.0;
          uVar18 = uVar18 + 1;
          local_50 = (double *)((long)local_50 + (__size ^ 0xfffffffffffffff8));
          uVar5 = uVar5 + uVar4;
          uVar24 = uVar24 + uVar4;
          local_78._0_4_ = (uint)local_78 + uVar4;
          uVar34 = uVar34 + uVar4;
          local_e8 = (ulong)((int)local_e8 - 1);
          uVar12 = uVar27;
        } while (uVar18 != uVar7);
        if (0 < N) {
          dVar36 = dVar36 * dVar43;
          local_70 = (void *)((long)__ptr + uVar10 * 8);
          local_90 = q + uVar10;
          local_110 = V + uVar6;
          local_d0 = uVar6 - 1;
          local_a0 = N;
LAB_0013f5ce:
          local_90 = local_90 + -1;
          local_110 = local_110 + -1;
          uVar12 = local_d0 - 1;
          iVar3 = 1;
          do {
            lVar13 = 0;
            iVar35 = local_a0;
            do {
              if (ABS(*(double *)((long)local_70 + lVar13)) <= dVar36) {
                uVar24 = iVar35 - 1;
                goto LAB_0013f762;
              }
              if (ABS(*(double *)((long)local_90 + lVar13)) <= dVar36) break;
              iVar35 = iVar35 + -1;
              lVar13 = lVar13 + -8;
            } while (0 < iVar35);
            uVar24 = iVar35 - 1;
            lVar13 = (long)(int)uVar24;
            if (lVar13 <= (long)local_d0) {
              dVar41 = 0.0;
              lVar33 = 0;
              dVar40 = 1.0;
              lVar28 = lVar13;
              do {
                dVar42 = *(double *)((long)__ptr + lVar28 * 8);
                dVar40 = dVar40 * dVar42;
                *(double *)((long)__ptr + lVar28 * 8) = dVar41 * dVar42;
                if (ABS(dVar40) <= dVar36) break;
                dVar41 = q[lVar28];
                dVar42 = hypot(dVar40,dVar41);
                q[lVar28] = dVar42;
                dVar41 = dVar41 / dVar42;
                dVar40 = -dVar40 / dVar42;
                uVar10 = uVar14;
                pdVar9 = U + lVar13;
                if (0 < M) {
                  do {
                    dVar42 = pdVar9[-1];
                    dVar43 = *(double *)((long)pdVar9 + lVar33);
                    pdVar9[-1] = dVar42 * dVar41 + dVar40 * dVar43;
                    *(double *)((long)pdVar9 + lVar33) = dVar43 * dVar41 - dVar40 * dVar42;
                    uVar10 = uVar10 - 1;
                    pdVar9 = pdVar9 + uVar6;
                  } while (uVar10 != 0);
                }
                lVar33 = lVar33 + 8;
                bVar2 = lVar28 < (long)local_d0;
                lVar28 = lVar28 + 1;
              } while (bVar2);
            }
LAB_0013f762:
            dVar41 = q[local_d0];
            if (local_d0 == uVar24) goto LAB_0013fb5b;
            lVar13 = (long)(int)uVar24;
            dVar40 = q[lVar13];
            dVar42 = q[uVar12];
            dVar43 = *(double *)((long)__ptr + uVar12 * 8);
            dVar38 = *(double *)((long)__ptr + local_d0 * 8);
            dVar43 = ((dVar42 / dVar38 + ((dVar43 - dVar41) / dVar42) * ((dVar41 + dVar43) / dVar38)
                      ) - dVar38 / dVar42) * 0.5;
            dVar37 = hypot(dVar43,1.0);
            dVar41 = (dVar38 / dVar40) *
                     (dVar42 / ((double)((ulong)-dVar37 & -(ulong)(dVar43 < 0.0) |
                                        ~-(ulong)(dVar43 < 0.0) & (ulong)dVar37) + dVar43) - dVar38)
                     + (dVar40 - (dVar41 / dVar40) * dVar41);
            if (lVar13 < (long)local_d0) {
              pdVar9 = V + lVar13 + 1;
              lVar33 = lVar13 << 0x20;
              pdVar32 = U + lVar13 + 1;
              dVar43 = 1.0;
              dVar42 = 1.0;
              lVar28 = lVar13;
              do {
                lVar1 = lVar28 + 1;
                dVar38 = *(double *)((long)__ptr + lVar28 * 8 + 8);
                dVar37 = q[lVar28 + 1];
                dVar43 = dVar43 * dVar38;
                dVar42 = dVar42 * dVar38;
                dVar38 = hypot(dVar41,dVar43);
                *(double *)((long)__ptr + lVar28 * 8) = dVar38;
                dVar41 = dVar41 / dVar38;
                dVar38 = dVar43 / dVar38;
                __x = dVar40 * dVar41 + dVar42 * dVar38;
                dVar40 = dVar42 * dVar41 - dVar38 * dVar40;
                dVar43 = dVar37 * dVar38;
                dVar37 = dVar37 * dVar41;
                uVar10 = uVar7;
                lVar20 = lVar33;
                pdVar8 = pdVar9;
                do {
                  dVar42 = *(double *)((long)V + (lVar20 >> 0x1d));
                  dVar39 = *pdVar8;
                  *(double *)((long)V + (lVar20 >> 0x1d)) = dVar42 * dVar41 + dVar38 * dVar39;
                  *pdVar8 = dVar39 * dVar41 - dVar38 * dVar42;
                  pdVar8 = pdVar8 + uVar6;
                  lVar20 = lVar20 + (uVar6 << 0x20);
                  uVar10 = uVar10 - 1;
                } while (uVar10 != 0);
                dVar39 = hypot(__x,dVar43);
                dVar43 = dVar43 / dVar39;
                if ((dVar39 == 0.0) && (!NAN(dVar39))) {
                  dVar43 = dVar38;
                }
                dVar42 = __x / dVar39;
                if ((dVar39 == 0.0) && (!NAN(dVar39))) {
                  dVar42 = dVar41;
                }
                q[lVar28] = dVar39;
                uVar10 = uVar14;
                lVar28 = lVar33;
                pdVar8 = pdVar32;
                if (0 < M) {
                  do {
                    dVar41 = *(double *)((long)U + (lVar28 >> 0x1d));
                    dVar38 = *pdVar8;
                    *(double *)((long)U + (lVar28 >> 0x1d)) = dVar41 * dVar42 + dVar43 * dVar38;
                    *pdVar8 = dVar38 * dVar42 - dVar43 * dVar41;
                    uVar10 = uVar10 - 1;
                    lVar28 = lVar28 + (uVar6 << 0x20);
                    pdVar8 = pdVar8 + uVar6;
                  } while (uVar10 != 0);
                }
                dVar41 = dVar42 * dVar40 + dVar37 * dVar43;
                dVar40 = dVar42 * dVar37 - dVar40 * dVar43;
                pdVar9 = pdVar9 + 1;
                lVar33 = lVar33 + 0x100000000;
                pdVar32 = pdVar32 + 1;
                lVar28 = lVar1;
              } while (lVar1 < (long)local_d0);
            }
            *(undefined8 *)((long)__ptr + lVar13 * 8) = 0;
            *(double *)((long)__ptr + local_d0 * 8) = dVar41;
            q[local_d0] = dVar40;
            iVar3 = iVar3 + 1;
            if (iVar3 == 0x33) {
              puts("Convergence Not Achieved ");
              return 0xf;
            }
          } while( true );
        }
      }
    }
  }
LAB_0013fbc7:
  svd_sort(U,M,N,V,q);
  free(__ptr);
  return 0;
LAB_0013fb5b:
  if (dVar41 < 0.0) {
    q[local_d0] = -dVar41;
    uVar10 = uVar7;
    pdVar9 = local_110;
    do {
      *pdVar9 = -*pdVar9;
      pdVar9 = pdVar9 + uVar6;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  local_a0 = local_a0 + -1;
  local_70 = (void *)((long)local_70 + -8);
  bVar2 = (long)local_d0 < 1;
  local_d0 = uVar12;
  if (bVar2) goto LAB_0013fbc7;
  goto LAB_0013f5ce;
}

Assistant:

int svd_gr(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,scale,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */

	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	g = scale = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = scale * g;
		g = 0.0;
		s = 0.0;
		scale = 0.0;

		if (i < M) {
			for(k = i; k < M;++k) {
				scale += fabs(U[k*N+i]);
			}

			if (scale != 0.0) {
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] /= scale;
					temp = U[t+i];
					s += temp*temp;
				}
				f = U[i*N+i];
				g = (f < 0) ? sqrt(s) : -sqrt(s);
				h = f * g - s;
				U[i*N+i] = f - g;

				if (i < N - 1) {
					for(j = l; j < N;++j) {
						s = 0.0;
						for(k = i; k < M;++k) {
							t = k * N;
							s += U[t+i]*U[t+j];
						}
						f = s / h;
						for(k = i; k < M;++k) {
							t = k * N;
							U[t+j] += f * U[t+i];
						}
					}
				}
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] *= scale;
				}
			}
		}
        q[i] = scale * g;
        g = 0.0;
        s = 0.0;
        scale = 0.0;

        if (i < M && i != N - 1) {
        	t = i *N;
        	for(k = l; k < M;++k) {
        		scale += fabs(U[t+k]);
        	}
        	if (scale != 0.0) {
        		for(k = l; k < N;++k) {
        			U[t+k] /= scale;
        			temp = U[t+k];
        			s = s + temp*temp;
        		}
        		f = U[t+l];
        		g = (f < 0) ? sqrt(s) : -sqrt(s);
                h = f * g - s;
                U[t+l] = f - g;
                for(k = l;k < N;++k) {
                	e[k] = U[t+k] / h;
                }

				for (j = l; j < M; j++) {
					s = 0.0;
					t2 = j * N;
					for (k = l; k < N; k++) {
						s += U[t2+k] * U[t+k];
					}
					for (k = l; k < N; k++) {
						U[t2+k] += s * e[k];
					}
				}
                for (k = l; k < N; k++)
                    U[t+k] *= scale;
        	}

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	//Accumulating Right Hand Transformations

		for(i = N - 1;i >= 0;--i) {
			t = i * N;
			if (i < N - 1) {
				if (g != 0.0) {
					h = U[t+i+1] * g;
					for(j = l;j < N;++j) {
						V[j*N+i] = U[t+j] / h;
					}
					for(j = l;j < N;++j) {
						s = 0.0;
						for(k = l; k < N;++k) {
							s += U[t+k] * V[k*N+j];
						}
						for(k = l; k < N;++k) {
							V[k*N+j] += (s * V[k*N+i]);
						}
					}
				}
				for(j = l; j < N;++j) {
					V[t+j] = V[j*N+i] = 0.0;
				}
			}
		    V[t+i] = 1.0;
			g = e[i];
			l = i;
		}



	//Accumulating Left Hand Transformations

		for(i = N - 1;i >= 0;--i) {
			t = i * N;
			l = i+1;
			g = q[i];

			if (i < N - 1) {
				for(j = l;j < N;++j) {
					U[t+j] = 0.0;
				}
			}

			if (g != 0.0) {
				if (i != N - 1) {
					//h = U[t+i] * g;
					for(j = l;j < N;++j) {
						s = 0.0;
						for(k = l; k < M;++k) {
							s += (U[k*N+i] * U[k*N+j]);
						}
						f = (s / U[t+i]) / g;
						for(k = i; k < M;++k) {
							U[k*N+j] += (f * U[k*N+i]);
						}
					}
				}
				for(j = i; j < M;++j) {
					U[j*N+i] = U[j*N+i] / g;
				}
			} else {
				for(j = i; j < M;++j) {
					U[j*N+i] = 0.0;
				}
			}

			U[t+i] += 1.0;
		}
	//	mdisplay(U,M,N);

		eps = eps * x;

		for(k = N - 1; k >= 0; --k) {
			iter = 0;

			while(1) {
				iter++;
				if (iter > SVDMAXITER) {
					printf("Convergence Not Achieved \n");
					return 15;
				}

				cancel = 1;
				for(l = k; l >= 0; --l) {
					if (fabs(e[l]) <= eps) {
						cancel = 0; //test f convergence
						break;
					}
					if (fabs(q[l-1]) <= eps) {
						//Cancel
						break;
					}
				}
				if (cancel) {
					c = 0.0;
					s = 1.0;
					l1 = l - 1;
					for(i = l; i <= k;++i) {
						f = s*e[i];
						e[i] *= c;
						if (fabs(f) <= eps) {
							break;
						}
						g = q[i];
						h = q[i] = hypot(f,g);
						c = g/h;
						s = -f/h;
						for(j = 0; j < M;++j) {
							t = j * N;
							y = U[t+l1];
							z = U[t+i];

							U[t+l1] = y * c + z * s;
							U[t+i] = z * c - y * s;
						}
					}
				}
				z = q[k];
				if (l != k) {
					x = q[l];
					y = q[k-1];
					g = e[k-1];
					h = e[k];
					f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
					g = hypot(f,1.0);
					if (f < 0.0) {
						temp = f - g;
					} else {
						temp = f+g;
					}
					f = x - (z / x) * z + (h / x) * (y / temp - h);

					//Next QR Transformation

					c = s = 1.0;
					for(i = l+1; i <= k;++i) {
						g = e[i];
						y = q[i];
						h = s * g;
						g = c * g;
						e[i-1] = z = hypot(f,h);
	                    c = f / z;
	                    s = h / z;
	                    f = x * c + g * s;
	                    g = g * c - x * s;
	                    h = y * s;
	                    y *= c;
	                    for(j = 0; j < N;++j) {
	                    	t = j * N;
	                        x = V[t+i-1];
	                        z = V[t+i];
	                        V[t+i-1] = x * c + z * s;
	                        V[t+i] = z * c - x * s;
	                    }
	                    q[i-1] = z = hypot(f,h);
	                    if (z != 0.0) {
	                        c = f / z;
	                        s = h / z;
	                    }
	                    f = c * g + s * y;
	                    x = c * y - s * g;
	                    for(j = 0; j < M;++j) {
	                    	t = j * N;
	                        y = U[t+i-1];
	                        z = U[t+i];
	                        U[t+i-1] = y * c + z * s;
	                        U[t+i] = z * c - y * s;
	                    }
					}
	                    e[l] = 0.0;
	                    e[k] = f;
	                    q[k] = x;

				} else {
					//convergence
	                if (z < 0.0) {
	                    q[k] = -z;
	                    for (j = 0; j < N; j++) {
	                    	t = j *N;
	                        V[t+k] = -V[t+k];
	                    }
	                }
	                break;
				}
			}
		}

		svd_sort(U,M,N,V,q);

		free(e);
		return ierr;
}